

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pam.c
# Opt level: O1

int pam_write_file(pam_t *pam,char *outpath)

{
  uint uVar1;
  FILE *__stream;
  size_t sVar2;
  int iVar3;
  size_t __n;
  
  __stream = fopen(outpath,"w+");
  if (__stream == (FILE *)0x0) {
    iVar3 = -1;
  }
  else {
    uVar1 = pam->type - 5000;
    if (3 < uVar1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/pam.c"
                    ,0xb3,"int pam_write_file(pam_t *, const char *)");
    }
    fprintf(__stream,"P7\nWIDTH %d\nHEIGHT %d\nDEPTH %d\nMAXVAL %d\nTUPLTYPE %s\nENDHDR\n",
            (ulong)(uint)pam->width,(ulong)(uint)pam->height,(ulong)(uint)pam->depth,
            (ulong)(uint)pam->maxval,&DAT_00408278 + *(int *)(&DAT_00408278 + (ulong)uVar1 * 4));
    __n = (long)pam->depth * (long)pam->height * (long)pam->width;
    sVar2 = fwrite(pam->data,1,__n,__stream);
    iVar3 = (uint)(sVar2 == __n) * 2 + -2;
    fclose(__stream);
  }
  return iVar3;
}

Assistant:

int pam_write_file(pam_t *pam, const char *outpath)
{
    FILE *f = fopen(outpath, "w+");
    if (!f)
        return -1;

    const char *tupl = NULL;
    switch (pam->type) {
        case PAM_GRAYSCALE_ALPHA:
            tupl = "GRAYSCALE_ALPHA";
            break;
        case PAM_RGB_ALPHA:
            tupl = "RGB_ALPHA";
            break;
        case PAM_RGB:
            tupl = "RGB";
            break;
        case PAM_GRAYSCALE:
            tupl = "GRAYSCALE";
            break;
        default:
            assert(0);
    }

    fprintf(f, "P7\nWIDTH %d\nHEIGHT %d\nDEPTH %d\nMAXVAL %d\nTUPLTYPE %s\nENDHDR\n",
            pam->width, pam->height, pam->depth, pam->maxval, tupl);
    int len = pam->width * pam->height * pam->depth;
    if (len != fwrite(pam->data, 1, len, f)) {
        fclose(f);
        return -2;
    }

    fclose(f);

    return 0;
}